

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cpp
# Opt level: O0

void error(String *msg)

{
  bool bVar1;
  runtime_error *this;
  char *pcVar2;
  String local_b0;
  String local_90;
  String local_70;
  TokenInfo *local_50;
  TokenInfo *tk;
  undefined1 local_38 [8];
  String fileinfo;
  Lexer *lx;
  String *msg_local;
  
  fileinfo._24_8_ = Lexer::GetCurrentLexer();
  String::String((String *)local_38);
  if ((fileinfo._24_8_ != 0) && (bVar1 = Lexer::hasValidToken((Lexer *)fileinfo._24_8_), bVar1)) {
    local_50 = Lexer::token((Lexer *)fileinfo._24_8_);
    String::String(&local_90,"%1:%2:%3: ");
    format<String,int,int>(&local_70,&local_90,&local_50->file,&local_50->line,&local_50->column);
    String::operator=((String *)local_38,&local_70);
    String::~String(&local_70);
    String::~String(&local_90);
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  String::operator+(&local_b0,(String *)local_38,msg);
  pcVar2 = String::c_str(&local_b0);
  std::runtime_error::runtime_error(this,pcVar2);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void error (const String& msg)
{
	Lexer* lx = Lexer::GetCurrentLexer();
	String fileinfo;

	if (lx != null and lx->hasValidToken())
	{
		Lexer::TokenInfo* tk = lx->token();
		fileinfo = format ("%1:%2:%3: ", tk->file, tk->line, tk->column);
	}

    throw std::runtime_error ((fileinfo + msg).c_str());
}